

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evp_ctx.cc
# Opt level: O1

void EVP_PKEY_CTX_free(EVP_PKEY_CTX *ctx)

{
  code *pcVar1;
  
  if (ctx != (EVP_PKEY_CTX *)0x0) {
    if ((*(long *)ctx != 0) && (pcVar1 = *(code **)(*(long *)ctx + 0x18), pcVar1 != (code *)0x0)) {
      (*pcVar1)(ctx);
    }
    EVP_PKEY_free(*(EVP_PKEY **)(ctx + 0x10));
    EVP_PKEY_free(*(EVP_PKEY **)(ctx + 0x18));
    OPENSSL_free(ctx);
    return;
  }
  return;
}

Assistant:

void EVP_PKEY_CTX_free(EVP_PKEY_CTX *ctx) {
  if (ctx == NULL) {
    return;
  }
  if (ctx->pmeth && ctx->pmeth->cleanup) {
    ctx->pmeth->cleanup(ctx);
  }
  EVP_PKEY_free(ctx->pkey);
  EVP_PKEY_free(ctx->peerkey);
  OPENSSL_free(ctx);
}